

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O2

void flatbuffers::PrintVector<double>
               (Vector<double> *v,Type type,int indent,int indent_step,string *_text)

{
  return_type val;
  int indent_00;
  uoffset_t i;
  ulong uVar1;
  
  std::__cxx11::string::append((char *)_text);
  std::__cxx11::string::append((char *)_text);
  indent_00 = indent_step + indent;
  for (uVar1 = 0; uVar1 < *(uint *)v; uVar1 = uVar1 + 1) {
    if (uVar1 != 0) {
      std::__cxx11::string::append((char *)_text);
      std::__cxx11::string::append((char *)_text);
    }
    std::__cxx11::string::append((ulong)_text,(char)indent_00);
    if ((type.base_type == BASE_TYPE_STRUCT) && ((type.struct_def)->fixed == true)) {
      Print<void_const*>(v + (type.struct_def)->bytesize * uVar1 + 4,type,indent_00,indent_step,
                         (StructDef *)0x0,_text);
    }
    else {
      val = Vector<double>::Get(v,(uoffset_t)uVar1);
      Print<double>(val,type,indent_00,indent_step,(StructDef *)0x0,_text);
    }
  }
  std::__cxx11::string::append((char *)_text);
  std::__cxx11::string::append((ulong)_text,(char)indent);
  std::__cxx11::string::append((char *)_text);
  return;
}

Assistant:

void PrintVector(const Vector<T> &v, Type type,
                                      int indent, int indent_step,
                                      std::string *_text) {
  std::string &text = *_text;
  text += "[";
  text += NewLine(indent_step);
  for (uoffset_t i = 0; i < v.Length(); i++) {
    if (i) {
      text += ",";
      text += NewLine(indent_step);
    }
    text.append(indent + indent_step, ' ');
    if (IsStruct(type))
      Print(v.GetStructFromOffset(i * type.struct_def->bytesize), type,
            indent + indent_step, indent_step, nullptr, _text);
    else
      Print(v.Get(i), type, indent + indent_step, indent_step, nullptr, _text);
  }
  text += NewLine(indent_step);
  text.append(indent, ' ');
  text += "]";
}